

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O2

void __thiscall
r_exec::AutoFocusController::notify(AutoFocusController *this,_Fact *target,View *input,TPXMap *map)

{
  atomic_int_fast64_t *paVar1;
  iterator __it;
  key_type local_20;
  
  if (target != (_Fact *)0x0) {
    LOCK();
    paVar1 = &(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object.refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  local_20.object = (_Object *)target;
  __it = std::
         _Hashtable<core::P<r_exec::_Fact>,_std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>,_std::__detail::_Select1st,_std::equal_to<core::P<r_exec::_Fact>_>,_r_code::PHash<r_exec::_Fact>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         ::find(&map->_M_h,&local_20);
  core::P<r_exec::_Fact>::~P(&local_20);
  if (__it.
      super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    (**(code **)(**(long **)((long)__it.
                                   super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
                                   ._M_cur + 0x10) + 0x18))
              (*(long **)((long)__it.
                                super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
                                ._M_cur + 0x10),input);
    std::
    _Hashtable<core::P<r_exec::_Fact>,_std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_std::allocator<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>_>,_std::__detail::_Select1st,_std::equal_to<core::P<r_exec::_Fact>_>,_r_code::PHash<r_exec::_Fact>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::erase(&map->_M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_core::P<r_exec::_Fact>,_core::P<r_exec::TPX>_>,_true>
            ._M_cur);
  }
  return;
}

Assistant:

inline void AutoFocusController::notify(_Fact *target, View *input, TPXMap &map)
{
    TPXMap::const_iterator m = map.find(target);

    if (m != map.end()) { // shall always be the case.
        m->second->signal(input); // will spawn a ReductionJob holding a P<> on m->second.
        map.erase(m);
    }
}